

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

ParseNodeClass * __thiscall
Parser::ParseClassDecl<true>
          (Parser *this,BOOL isDeclaration,LPCOLESTR pNameHint,uint32 *pHintLength,
          uint32 *pShortNameOffset)

{
  ushort *puVar1;
  Scanner_t *this_00;
  tokens tVar2;
  long lVar3;
  EncodedCharPtr puVar4;
  EncodedCharPtr puVar5;
  code *pcVar6;
  IdentPtr pMemberName;
  IdentPtr pIVar7;
  bool bVar8;
  bool bVar9;
  tokens tVar10;
  charcount_t cVar11;
  uint32 uVar12;
  IdentPtr pIVar13;
  ParseNodeFnc *pPVar14;
  ParseNodeBlock *pnodeBlock;
  LPCWSTR pWVar15;
  undefined8 extraout_RAX;
  IdentPtr pIVar16;
  undefined8 extraout_RAX_00;
  LPCOLESTR pOVar17;
  ParseNodeBin *pPVar18;
  ParseNodeBin *this_01;
  FncFlags FVar19;
  uint32 uVar20;
  ScriptContext *pSVar21;
  FncFlags FVar22;
  Parser *pPVar23;
  byte bVar24;
  ushort flags;
  uint uVar25;
  size_t sVar26;
  bool bVar27;
  undefined1 local_218 [8];
  ArenaAllocator tempAllocator;
  RestorePoint beginClass;
  ParseNode **local_158;
  ParseNodePtr *lastMemberNodeRef;
  LPCOLESTR emptyHint_1;
  char16_t *local_140;
  PidRefStack *local_138;
  ParseNodePtr pnodeMembers;
  ParseNodePtr *ppnodeScopeSave;
  ParseNodePtr *ppnodeExprScopeSave;
  undefined1 auStack_118 [8];
  RestorePoint beginStatic;
  State state;
  ParseNodePtr local_b8;
  IdentPtr local_b0;
  IdentPtr pidHint;
  IdentPtr local_a0;
  ParseNodeStr *local_98;
  ParseNodePtr pnodeMemberName;
  undefined8 local_88;
  LPCOLESTR local_80;
  LPCOLESTR pMemberNameHint;
  ParseNodeFnc *local_70;
  IdentPtr local_68;
  uint32 local_60;
  uint32 local_5c;
  IdentPtr local_58;
  uint32 local_4c;
  uint local_48;
  uint32 memberNameOffset;
  Parser *local_40;
  byte local_35;
  uint32 local_34 [2];
  uint32 memberNameHintLength;
  
  local_138 = (PidRefStack *)0x0;
  local_158 = (ParseNode **)0x0;
  local_60 = 0;
  local_5c = 0;
  if (pHintLength != (uint32 *)0x0) {
    local_5c = *pHintLength;
  }
  if (pShortNameOffset != (uint32 *)0x0) {
    local_60 = *pShortNameOffset;
  }
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_218,
             L"ClassMemberNames",
             (this->m_nodeAllocator).
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
             super_ArenaData.pageAllocator,OutOfMemory,JsUtil::ExternalApi::RecoverUnusedMemory);
  pidHint = (IdentPtr)CreateNodeForOpT<(OpCode)86>(this);
  this_00 = &this->m_scan;
  emptyHint_1 = (LPCOLESTR)((this->m_scan).m_pchMinTok + -(long)(this->m_scan).m_pchBase);
  beginStatic.m_cMultiUnits._4_4_ = this->m_fUseStrictMode;
  this->m_fUseStrictMode = 1;
  Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
  if ((this->m_token).tk == tkID) {
    pIVar13 = Token::GetIdentifier((Token *)&this->m_token,&(this->m_scan).m_htbl);
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
  }
  else {
    if (isDeclaration != 0) {
      IdentifierExpectedError(this,&this->m_token);
      pPVar23 = this;
LAB_00d00a2e:
      Error(pPVar23,-0x7ff5fc16,L"",L"");
    }
    pIVar13 = (IdentPtr)0x0;
  }
  local_40 = (Parser *)this_00;
  if ((isDeclaration == 0) || (pIVar13 != (this->wellKnownPropertyPids).arguments)) {
    if (isDeclaration == 0) {
      ppnodeExprScopeSave = (ParseNodePtr *)0x0;
      goto LAB_00cffdf3;
    }
  }
  else if ((this->m_currentBlockInfo->pnodeBlock->field_0x5c & 3) == 1) {
    pPVar14 = GetCurrentFunctionNode(this);
    puVar1 = &(pPVar14->super_ParseNode).grfpn;
    *(byte *)puVar1 = (byte)*puVar1 | 1;
  }
  ppnodeExprScopeSave = (ParseNodePtr *)CreateBlockScopedDeclNode(this,pIVar13,knopLetDecl);
LAB_00cffdf3:
  pnodeMembers = (ParseNodePtr)0x0;
  ppnodeScopeSave = (ParseNodePtr *)0x0;
  pnodeBlock = StartParseBlockHelper<true>(this,Regular,(Scope *)0x0,(LabelId *)0x0);
  pPVar23 = this;
  PushFuncBlockScope(this,pnodeBlock,(ParseNodePtr **)&pnodeMembers,&ppnodeScopeSave);
  *(ParseNodeBlock **)&pidHint->assignmentState = pnodeBlock;
  if (pIVar13 == (IdentPtr)0x0) {
    pMemberNameHint = (LPCOLESTR)0x0;
  }
  else {
    pPVar23 = this;
    pMemberNameHint = (LPCOLESTR)CreateBlockScopedDeclNode(this,pIVar13,knopConstDecl);
  }
  tVar2 = (this->m_token).tk;
  if (tVar2 == tkEXTENDS) {
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan
              ((Scanner<UTF8EncodingPolicyBase<false>_> *)local_40);
    pPVar23 = this;
    local_b8 = ParseTerm<true>(this,1,(LPCOLESTR)0x0,(uint32 *)0x0,(uint32 *)0x0,(IdentToken *)0x0,
                               false,1,(BOOL *)0x0,(BOOL *)0x0,(bool *)0x0,(charcount_t *)0x0,
                               (bool *)0x0);
    tVar10 = (this->m_token).tk;
  }
  else {
    local_b8 = (ParseNodePtr)0x0;
    tVar10 = tVar2;
  }
  if (tVar10 != tkLCurly) {
    Error(pPVar23,-0x7ff5fc10,L"",L"");
  }
  pWVar15 = GetParseType(this);
  local_140 = L"anonymous class";
  if (pIVar13 != (IdentPtr)0x0) {
    local_140 = (char16_t *)&pIVar13->field_0x22;
  }
  Output::TraceWithFlush(ES6VerboseFlag,L"Parsing class (%s) : %s\n",pWVar15);
  pPVar23 = local_40;
  tempAllocator.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList.
  _0_4_ = 0xffffffff;
  tempAllocator.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList.
  _4_4_ = 0xffffffff;
  Scanner<UTF8EncodingPolicyBase<false>_>::Capture
            ((Scanner<UTF8EncodingPolicyBase<false>_> *)local_40,
             (RestorePoint *)
             &tempAllocator.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
              .freeList);
  Scanner<UTF8EncodingPolicyBase<false>_>::ScanForcingPid
            ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar23);
  if (pMemberNameHint == (LPCOLESTR)0x0) {
    local_a0 = (IdentPtr)0x0;
  }
  else {
    local_a0 = *(IdentPtr *)(pMemberNameHint + 0xc);
  }
  pnodeMemberName = (ParseNodePtr)__tls_get_addr(&PTR_013e5f18);
  local_70 = (ParseNodeFnc *)0x0;
  bVar9 = false;
  pPVar23 = local_40;
  do {
    while (tVar10 = (this->m_token).tk, tVar10 == tkSColon) {
      Scanner<UTF8EncodingPolicyBase<false>_>::ScanForcingPid
                ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar23);
    }
    if (tVar10 == tkSTATIC) {
      beginStatic.m_cMinTokMultiUnits._0_4_ = 0xffffffff;
      beginStatic.m_cMinTokMultiUnits._4_4_ = 0xffffffff;
      beginStatic.m_cMinLineMultiUnits._0_4_ = 0xffffffff;
      auStack_118 = (undefined1  [8])0xffffffffffffffff;
      beginStatic.m_ichMinTok = 0xffffffff;
      beginStatic.m_ichMinLine = 0xffffffff;
      beginStatic._20_16_ = (undefined1  [16])0x0;
      beginStatic.m_fHadEol = -1;
      beginStatic._44_4_ = 0xffffffff;
      Scanner<UTF8EncodingPolicyBase<false>_>::Capture
                ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar23,(RestorePoint *)auStack_118);
      tVar10 = Scanner<UTF8EncodingPolicyBase<false>_>::ScanForcingPid
                         ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar23);
      bVar8 = (this->m_token).tk != tkLParen;
      local_68 = (IdentPtr)CONCAT44(local_68._4_4_,CONCAT31((int3)(tVar10 >> 8),bVar8));
      if (!bVar8) {
        Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo
                  ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar23,(RestorePoint *)auStack_118);
      }
    }
    else {
      if (tVar10 == tkRCurly) {
        cVar11 = Scanner<UTF8EncodingPolicyBase<false>_>::IchLimTok
                           ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar23);
        *(charcount_t *)&pidHint->m_pidRefStack = cVar11;
        puVar4 = (this->m_scan).m_currentCharacter;
        puVar5 = (this->m_scan).m_pchBase;
        if (!bVar9) {
          pWVar15 = GetParseType(this);
          Output::TraceWithFlush
                    (ES6VerboseFlag,L"Generating constructor (%s) : %s\n",pWVar15,local_140);
          beginStatic.m_cMinTokMultiUnits._0_4_ = 0xffffffff;
          beginStatic.m_cMinTokMultiUnits._4_4_ = 0xffffffff;
          beginStatic.m_cMinLineMultiUnits._0_4_ = 0xffffffff;
          auStack_118 = (undefined1  [8])0xffffffffffffffff;
          beginStatic.m_ichMinTok = 0xffffffff;
          beginStatic.m_ichMinLine = 0xffffffff;
          beginStatic._20_16_ = (undefined1  [16])0x0;
          beginStatic.m_fHadEol = -1;
          beginStatic._44_4_ = 0xffffffff;
          Scanner<UTF8EncodingPolicyBase<false>_>::Capture
                    ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar23,(RestorePoint *)auStack_118)
          ;
          Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo
                    ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar23,
                     (RestorePoint *)
                     &tempAllocator.
                      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                      freeList);
          local_70 = GenerateEmptyConstructor<true>(this,local_b8 != (ParseNodePtr)0x0);
          if (local_a0 == (IdentPtr)0x0) {
            if (local_5c < local_60) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              pnodeMemberName->nop = knopName;
              pnodeMemberName->field_0x1 = 0;
              pnodeMemberName->grfpn = 0;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                 ,0x2016,"(nameHintLength >= nameHintOffset)",
                                 "nameHintLength >= nameHintOffset");
              if (!bVar9) {
LAB_00d009d1:
                pcVar6 = (code *)invalidInstructionException();
                (*pcVar6)();
              }
              pnodeMemberName->nop = knopNone;
              pnodeMemberName->field_0x1 = 0;
              pnodeMemberName->grfpn = 0;
            }
            local_70->hint = pNameHint;
            uVar20 = local_5c;
            uVar12 = local_60;
          }
          else {
            local_70->hint = (LPCOLESTR)&local_a0->field_0x22;
            uVar20 = local_a0->m_cch;
            uVar12 = 0;
          }
          local_70->hintLength = uVar20;
          local_70->hintOffset = uVar12;
          local_70->pid = local_a0;
          Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo
                    ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar23,(RestorePoint *)auStack_118)
          ;
        }
        local_70->cbStringMin = (size_t)emptyHint_1;
        local_70->cbStringLim = (long)puVar4 - (long)puVar5;
        PopFuncBlockScope(this,(ParseNodePtr *)pnodeMembers,ppnodeScopeSave);
        *(ParseNodePtr **)&pidHint->m_cch = ppnodeExprScopeSave;
        *(LPCOLESTR *)&pidHint->m_tk = pMemberNameHint;
        pidHint[1].m_pidNext = (Ident *)local_70;
        *(ParseNodePtr *)&pidHint[1].m_tk = local_b8;
        pidHint[1].m_pidRefStack = local_138;
        *(undefined1 *)&pidHint[1].m_cch = 0;
        FinishParseBlock(this,pnodeBlock,true);
        this->m_fUseStrictMode = beginStatic.m_cMultiUnits._4_4_;
        Scanner<UTF8EncodingPolicyBase<false>_>::Scan
                  ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar23);
        Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
        ~ArenaAllocatorBase((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            local_218);
        return (ParseNodeClass *)pidHint;
      }
      local_68 = (IdentPtr)((ulong)local_68 & 0xffffffff00000000);
    }
    Scanner<UTF8EncodingPolicyBase<false>_>::IchMinTok
              ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar23);
    sVar26 = (long)(this->m_scan).m_pchMinTok - (long)(this->m_scan).m_pchBase;
    local_98 = (ParseNodeStr *)0x0;
    local_b0 = (IdentPtr)0x0;
    local_80 = (LPCOLESTR)0x0;
    local_34[0] = 0;
    local_4c = 0;
    bVar8 = CheckContextualKeyword(this,(this->wellKnownPropertyPids).async);
    pSVar21 = this->m_scriptContext;
    if ((bVar8) && (((pSVar21->config).threadConfig)->m_ES7AsyncAwait == true)) {
      beginStatic.m_cMinTokMultiUnits._0_4_ = 0xffffffff;
      beginStatic.m_cMinTokMultiUnits._4_4_ = 0xffffffff;
      beginStatic.m_cMinLineMultiUnits._0_4_ = 0xffffffff;
      auStack_118 = (undefined1  [8])0xffffffffffffffff;
      beginStatic.m_ichMinTok = 0xffffffff;
      beginStatic.m_ichMinLine = 0xffffffff;
      beginStatic._20_16_ = (undefined1  [16])0x0;
      beginStatic.m_fHadEol = -1;
      beginStatic._44_4_ = 0xffffffff;
      Scanner<UTF8EncodingPolicyBase<false>_>::Capture
                ((Scanner<UTF8EncodingPolicyBase<false>_> *)local_40,(RestorePoint *)auStack_118);
      Scanner<UTF8EncodingPolicyBase<false>_>::IchMinTok
                ((Scanner<UTF8EncodingPolicyBase<false>_> *)local_40);
      sVar26 = (long)(this->m_scan).m_pchMinTok - (long)(this->m_scan).m_pchBase;
      Scanner<UTF8EncodingPolicyBase<false>_>::Scan
                ((Scanner<UTF8EncodingPolicyBase<false>_> *)local_40);
      bVar8 = (this->m_token).tk != tkLParen;
      bVar27 = (this->m_scan).m_fHadEol == 0;
      memberNameOffset = (uint32)CONCAT71((int7)((ulong)pSVar21 >> 8),bVar27 && bVar8);
      if (!bVar27 || !bVar8) {
        Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo
                  ((Scanner<UTF8EncodingPolicyBase<false>_> *)local_40,(RestorePoint *)auStack_118);
      }
      pSVar21 = this->m_scriptContext;
    }
    else {
      memberNameOffset = 0;
    }
    tVar10 = (this->m_token).tk;
    local_35 = tVar10 == tkStar & ((pSVar21->config).threadConfig)->m_ES6Generators;
    if (local_35 == 1) {
      Scanner<UTF8EncodingPolicyBase<false>_>::ScanForcingPid
                ((Scanner<UTF8EncodingPolicyBase<false>_> *)local_40);
      tVar10 = (this->m_token).tk;
      local_48 = CONCAT22(local_48._2_2_,0xe8);
    }
    else {
      local_48 = CONCAT22(local_48._2_2_,0x68);
    }
    pPVar23 = this;
    if ((tVar10 == tkLBrack) &&
       (((this->m_scriptContext->config).threadConfig)->m_ES6ObjectLiterals == true)) {
      auStack_118 = (undefined1  [8])0x0;
      ParseComputedName<true>
                (this,(ParseNodePtr *)&local_98,(LPCOLESTR *)auStack_118,&local_80,local_34,
                 &local_4c);
      local_88 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      bVar8 = false;
      pIVar13 = (IdentPtr)0x0;
LAB_00d0023b:
      pIVar16 = (IdentPtr)0x0;
    }
    else {
      bVar8 = ((this->m_scan).field_0x508 & 0x10) == 0;
      pIVar16 = ParseClassPropertyName(this,&local_b0);
      pIVar13 = local_b0;
      if (local_b0 != (IdentPtr)0x0) {
        local_80 = (LPCOLESTR)&local_b0->field_0x22;
        local_34[0] = local_b0->m_cch;
      }
      if (pIVar16 == (IdentPtr)0x0) {
        local_88 = 0;
        goto LAB_00d0023b;
      }
      pPVar23 = this;
      local_98 = CreateStrNode(this,pIVar16);
      local_88 = 0;
    }
    flags = (ushort)local_48;
    local_58 = pIVar16;
    if (pIVar16 == (this->wellKnownPropertyPids).constructor && (byte)local_68 == '\0') {
      if ((memberNameOffset & 1) != 0 || bVar9) {
        Error(pPVar23,-0x7ff5fc16,L"",L"");
      }
      pOVar17 = pNameHint;
      uVar25 = local_5c;
      uVar20 = local_60;
      if ((pMemberNameHint != (LPCOLESTR)0x0) &&
         (lVar3 = *(long *)(pMemberNameHint + 0xc), lVar3 != 0)) {
        uVar25 = *(uint *)(lVar3 + 0x18);
        pOVar17 = (LPCOLESTR)(lVar3 + 0x22);
        uVar20 = 0;
      }
      pPVar23 = this;
      local_70 = ParseFncDeclNoCheckScope<true>
                           (this,(ushort)local_48 | (ushort)(tVar2 != tkEXTENDS) << 0xb | 0x400,
                            (tVar2 != tkEXTENDS) + CallAndPropertyAllowed,pOVar17,true,false,true);
      if ((local_70->fncFlags & kFunctionIsGenerator) != kFunctionNone) {
        Error(pPVar23,-0x7ff5fbce,L"",L"");
      }
      if (uVar25 < uVar20) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        pnodeMemberName->nop = knopName;
        pnodeMemberName->field_0x1 = 0;
        pnodeMemberName->grfpn = 0;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                           ,0x1f82,"(constructorNameLength >= constructorShortNameHintOffset)",
                           "constructorNameLength >= constructorShortNameHintOffset");
        if (!bVar9) goto LAB_00d009d1;
        pnodeMemberName->nop = knopNone;
        pnodeMemberName->field_0x1 = 0;
        pnodeMemberName->grfpn = 0;
      }
      local_70->hint = pOVar17;
      local_70->hintLength = uVar25;
      local_70->hintOffset = uVar20;
      if ((pMemberNameHint == (LPCOLESTR)0x0) ||
         (pIVar13 = *(IdentPtr *)(pMemberNameHint + 0xc), pIVar13 == (IdentPtr)0x0)) {
        pIVar13 = (this->wellKnownPropertyPids).constructor;
      }
      local_70->pid = pIVar13;
      local_70->fncFlags = local_70->fncFlags | (kFunctionHasHomeObj|kFunctionHasNonThisStmt);
      bVar9 = true;
      pPVar23 = local_40;
    }
    else {
      beginStatic.m_cMinTokMultiUnits._0_4_ = 0xffffffff;
      beginStatic.m_cMinTokMultiUnits._4_4_ = 0xffffffff;
      beginStatic.m_cMinLineMultiUnits._0_4_ = 0xffffffff;
      auStack_118 = (undefined1  [8])0xffffffffffffffff;
      beginStatic.m_ichMinTok = 0xffffffff;
      beginStatic.m_ichMinLine = 0xffffffff;
      beginStatic._20_16_ = (undefined1  [16])0x0;
      beginStatic.m_fHadEol = -1;
      beginStatic._44_4_ = 0xffffffff;
      pPVar23 = local_40;
      Scanner<UTF8EncodingPolicyBase<false>_>::Capture
                ((Scanner<UTF8EncodingPolicyBase<false>_> *)local_40,(RestorePoint *)auStack_118);
      local_48 = (uint)(byte)local_68;
      if (bVar8) {
        if ((local_58 == (this->wellKnownPropertyPids).get) ||
           (local_58 == (this->wellKnownPropertyPids).set)) {
          pPVar23 = local_40;
          Scanner<UTF8EncodingPolicyBase<false>_>::ScanForcingPid
                    ((Scanner<UTF8EncodingPolicyBase<false>_> *)local_40);
        }
        tVar10 = (this->m_token).tk;
        if (tVar10 == tkLParen) {
LAB_00d00485:
          pPVar23 = local_40;
          Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo
                    ((Scanner<UTF8EncodingPolicyBase<false>_> *)local_40,(RestorePoint *)auStack_118
                    );
          goto LAB_00d00495;
        }
        pIVar16 = (this->wellKnownPropertyPids).get;
        if ((local_58 != pIVar16) && (local_58 != (this->wellKnownPropertyPids).set))
        goto LAB_00d00495;
        pPVar23 = this;
        if ((tVar10 == tkLBrack) &&
           (((this->m_scriptContext->config).threadConfig)->m_ES6ObjectLiterals == true)) {
          lastMemberNodeRef = (ParseNodePtr *)0x0;
          ParseComputedName<true>
                    (this,(ParseNodePtr *)&local_98,(LPCOLESTR *)&lastMemberNodeRef,&local_80,
                     local_34,&local_4c);
          local_88 = CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
          pIVar13 = local_58;
        }
        else {
          pIVar13 = ParseClassPropertyName(this,&local_b0);
        }
        pIVar7 = local_58;
        if ((byte)local_68 == '\0') {
          if ((~(byte)memberNameOffset & pIVar13 != (this->wellKnownPropertyPids).constructor) == 0)
          goto LAB_00d00a2e;
        }
        else if ((byte)memberNameOffset != 0 || pIVar13 == (this->wellKnownPropertyPids).prototype)
        goto LAB_00d00a2e;
        if (pIVar13 != (IdentPtr)0x0 && (char)local_88 == '\0') {
          local_98 = CreateStrNode(this,pIVar13);
        }
        pMemberName = local_b0;
        pOVar17 = (LPCOLESTR)&local_b0->field_0x22;
        if (local_b0 == (IdentPtr)0x0) {
          pOVar17 = (LPCOLESTR)0x0;
        }
        local_68 = pIVar13;
        pPVar14 = ParseFncDeclNoCheckScope<true>
                            (this,flags + (ushort)(pIVar7 != pIVar16) * 2 + 2,PropertyAllowed,
                             pOVar17,true,false,true);
        uVar25 = local_48;
        FVar22 = local_48 << 0x18 |
                 pPVar14->fncFlags &
                 (kFunctionHasAnyWriteToFormals|kFunctionIsDefaultModuleExport|
                  kFunctionHasDirectSuper|kFunctionIsAsync|kFunctionIsDeclaredInParamScope|
                  kFunctionAsmjsMode|kFunctionIsGenerator|kFunctionHasDefaultArguments|
                  kFunctionIsGeneratedDefault|kFunctionHasHomeObj|kFunctionIsClassMember|
                  kFunctionIsBaseClassConstructor|kFunctionIsClassConstructor|kFunctionIsMethod|
                  kFunctionHasSuperReference|kFunctionHasNonSimpleParameterList|
                  kFunctionChildCallsEval|kFunctionIsLambda|kFunctionHasWithStmt|
                  kFunctionHasComputedName|kFunctionIsModule|kFunctionHasDestructuredParams|
                  kFunctionStrictMode|kFunctionHasNonThisStmt|kFunctionIsAccessor|
                  kFunctionHasReferenceableBuiltInArguments|kFunctionHasHeapArguments|
                  kFunctionUsesArguments|kFunctionCallsEval|kFunctionDeclaration|kFunctionNested);
        bVar8 = SUB81(local_88,0);
        FVar19 = FVar22 | kFunctionHasComputedName;
        if (bVar8 == false) {
          FVar19 = FVar22;
        }
        pPVar14->fncFlags = FVar19 | (kFunctionHasHomeObj|kFunctionIsAccessor);
        this_01 = CreateBinNode(this,local_58 == pIVar16 | knopSetMember,&local_98->super_ParseNode,
                                &pPVar14->super_ParseNode);
        local_80 = ConstructFinalHintNode
                             (this,local_a0,pMemberName,
                              (&(this->wellKnownPropertyPids).set)[local_58 == pIVar16],
                              SUB41(uVar25,0),local_34,&local_4c,bVar8,local_80);
        pIVar13 = local_68;
      }
      else {
        if ((this->m_token).tk == tkLParen) goto LAB_00d00485;
LAB_00d00495:
        if (((byte)local_68 & local_58 == (this->wellKnownPropertyPids).prototype) == 1) {
          Error(pPVar23,-0x7ff5fc16,L"",L"");
        }
        bVar24 = (byte)memberNameOffset;
        if (bVar24 != 0) {
          flags = flags + 0x100;
        }
        pOVar17 = (LPCOLESTR)&pIVar13->field_0x22;
        if (pIVar13 == (IdentPtr)0x0) {
          pOVar17 = (LPCOLESTR)0x0;
        }
        pPVar14 = ParseFncDeclNoCheckScope<true>(this,flags,PropertyAllowed,pOVar17,true,false,true)
        ;
        bVar8 = SUB81(local_88,0);
        if ((byte)(bVar24 | local_35 | bVar8) == 1) {
          pPVar14->cbStringMin = sVar26;
          pPVar14->cbStringLim = pPVar14->cbLim;
        }
        FVar22 = local_48 << 0x18 |
                 pPVar14->fncFlags &
                 (kFunctionHasAnyWriteToFormals|kFunctionIsDefaultModuleExport|
                  kFunctionHasDirectSuper|kFunctionIsAsync|kFunctionIsDeclaredInParamScope|
                  kFunctionAsmjsMode|kFunctionIsGenerator|kFunctionHasDefaultArguments|
                  kFunctionIsGeneratedDefault|kFunctionHasHomeObj|kFunctionIsClassMember|
                  kFunctionIsBaseClassConstructor|kFunctionIsClassConstructor|kFunctionIsMethod|
                  kFunctionHasSuperReference|kFunctionHasNonSimpleParameterList|
                  kFunctionChildCallsEval|kFunctionIsLambda|kFunctionHasWithStmt|
                  kFunctionHasComputedName|kFunctionIsModule|kFunctionHasDestructuredParams|
                  kFunctionStrictMode|kFunctionHasNonThisStmt|kFunctionIsAccessor|
                  kFunctionHasReferenceableBuiltInArguments|kFunctionHasHeapArguments|
                  kFunctionUsesArguments|kFunctionCallsEval|kFunctionDeclaration|kFunctionNested);
        FVar19 = FVar22 | kFunctionHasComputedName;
        if (bVar8 == false) {
          FVar19 = FVar22;
        }
        pPVar14->fncFlags = FVar19 | kFunctionHasHomeObj;
        this_01 = CreateBinNode(this,knopMember,&local_98->super_ParseNode,&pPVar14->super_ParseNode
                               );
        local_80 = ConstructFinalHintNode
                             (this,local_a0,pIVar13,(IdentPtr)0x0,SUB41(local_48,0),local_34,
                              &local_4c,bVar8,local_80);
        pIVar13 = local_58;
      }
      if (local_34[0] < local_4c) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        pnodeMemberName->nop = knopName;
        pnodeMemberName->field_0x1 = 0;
        pnodeMemberName->grfpn = 0;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                           ,0x1ff0,"(memberNameHintLength >= memberNameOffset)",
                           "memberNameHintLength >= memberNameOffset");
        if (!bVar8) goto LAB_00d009d1;
        pnodeMemberName->nop = knopNone;
        pnodeMemberName->field_0x1 = 0;
        pnodeMemberName->grfpn = 0;
      }
      pOVar17 = local_80;
      pPVar18 = ParseNode::AsParseNodeBin(&this_01->super_ParseNode);
      pPVar14 = ParseNode::AsParseNodeFnc(pPVar18->pnode2);
      uVar12 = local_34[0];
      pPVar14->hint = pOVar17;
      pPVar18 = ParseNode::AsParseNodeBin(&this_01->super_ParseNode);
      pPVar14 = ParseNode::AsParseNodeFnc(pPVar18->pnode2);
      uVar20 = local_4c;
      pPVar14->hintLength = uVar12;
      pPVar18 = ParseNode::AsParseNodeBin(&this_01->super_ParseNode);
      pPVar14 = ParseNode::AsParseNodeFnc(pPVar18->pnode2);
      pPVar14->hintOffset = uVar20;
      pPVar18 = ParseNode::AsParseNodeBin(&this_01->super_ParseNode);
      pPVar14 = ParseNode::AsParseNodeFnc(pPVar18->pnode2);
      pPVar14->pid = pIVar13;
      AddToNodeList(this,(ParseNode **)&local_138,&local_158,&this_01->super_ParseNode);
      pPVar23 = local_40;
    }
  } while( true );
}

Assistant:

ParseNodeClass * Parser::ParseClassDecl(BOOL isDeclaration, LPCOLESTR pNameHint, uint32 *pHintLength, uint32 *pShortNameOffset)
{
    bool hasConstructor = false;
    bool hasExtends = false;
    IdentPtr name = nullptr;
    ParseNodeVar * pnodeName = nullptr;
    ParseNodeFnc * pnodeConstructor = nullptr;
    ParseNodePtr pnodeExtends = nullptr;
    ParseNodePtr pnodeMembers = nullptr;
    ParseNodePtr *lastMemberNodeRef = nullptr;
    uint32 nameHintLength = pHintLength ? *pHintLength : 0;
    uint32 nameHintOffset = pShortNameOffset ? *pShortNameOffset : 0;

    ArenaAllocator tempAllocator(_u("ClassMemberNames"), m_nodeAllocator.GetPageAllocator(), Parser::OutOfMemory);

    size_t cbMinConstructor = 0;
    ParseNodeClass * pnodeClass = nullptr;
    if (buildAST)
    {
        pnodeClass = CreateNodeForOpT<knopClassDecl>();

        CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, Class, m_scriptContext);

        cbMinConstructor = this->GetScanner()->IecpMinTok();
    }

    BOOL strictSave = m_fUseStrictMode;
    m_fUseStrictMode = TRUE;

    this->GetScanner()->Scan();
    if (m_token.tk == tkID)
    {
        name = m_token.GetIdentifier(this->GetHashTbl());
        this->GetScanner()->Scan();
    }
    else if (isDeclaration)
    {
        IdentifierExpectedError(m_token);
    }

    if (isDeclaration && name == wellKnownPropertyPids.arguments && GetCurrentBlockInfo()->pnodeBlock->blockType == Function)
    {
        GetCurrentFunctionNode()->grfpn |= PNodeFlags::fpnArguments_overriddenByDecl;
    }

    ParseNodeVar * pnodeDeclName = nullptr;
    if (isDeclaration)
    {
        pnodeDeclName = CreateBlockScopedDeclNode(name, knopLetDecl);
    }

    ParseNodePtr *ppnodeScopeSave = nullptr;
    ParseNodePtr *ppnodeExprScopeSave = nullptr;

    ParseNodeBlock * pnodeBlock = StartParseBlock<buildAST>(PnodeBlockType::Regular, ScopeType_Block);
    if (buildAST)
    {
        PushFuncBlockScope(pnodeBlock, &ppnodeScopeSave, &ppnodeExprScopeSave);
        pnodeClass->pnodeBlock = pnodeBlock;
    }

    if (name)
    {
        pnodeName = CreateBlockScopedDeclNode(name, knopConstDecl);
    }

    if (m_token.tk == tkEXTENDS)
    {
        this->GetScanner()->Scan();
        pnodeExtends = ParseTerm<buildAST>();
        hasExtends = true;
    }

    if (m_token.tk != tkLCurly)
    {
        Error(ERRnoLcurly);
    }

    OUTPUT_TRACE_DEBUGONLY(Js::ES6VerboseFlag, _u("Parsing class (%s) : %s\n"), GetParseType(), name ? name->Psz() : _u("anonymous class"));

    RestorePoint beginClass;
    this->GetScanner()->Capture(&beginClass);

    this->GetScanner()->ScanForcingPid();

    IdentPtr pClassNamePid = pnodeName ? pnodeName->pid : nullptr;

    for (;;)
    {
        if (m_token.tk == tkSColon)
        {
            this->GetScanner()->ScanForcingPid();
            continue;
        }
        if (m_token.tk == tkRCurly)
        {
            break;
        }

        bool isStatic = false;
        if (m_token.tk == tkSTATIC)
        {
            // 'static' can be used as an IdentifierName here, even in strict mode code. We need to see the next token before we know
            // if this is being used as a keyword. This is similar to the way we treat 'let' in some cases.
            // See https://tc39.github.io/ecma262/#sec-keywords for more info.

            RestorePoint beginStatic;
            this->GetScanner()->Capture(&beginStatic);

            this->GetScanner()->ScanForcingPid();

            if (m_token.tk == tkLParen)
            {
                this->GetScanner()->SeekTo(beginStatic);
            }
            else
            {
                isStatic = true;
            }
        }

        ushort fncDeclFlags = fFncNoName | fFncMethod | fFncClassMember;
        charcount_t ichMin = this->GetScanner()->IchMinTok();
        size_t iecpMin = this->GetScanner()->IecpMinTok();
        ParseNodePtr pnodeMemberName = nullptr;
        IdentPtr pidHint = nullptr;
        IdentPtr memberPid = nullptr;
        bool maybeAccessor = false;
        LPCOLESTR pMemberNameHint = nullptr;
        uint32 memberNameHintLength = 0;
        uint32 memberNameOffset = 0;
        bool isComputedName = false;
        bool isAsyncMethod = false;

        if (CheckContextualKeyword(wellKnownPropertyPids.async) && m_scriptContext->GetConfig()->IsES7AsyncAndAwaitEnabled())
        {
            RestorePoint parsedAsync;
            this->GetScanner()->Capture(&parsedAsync);
            ichMin = this->GetScanner()->IchMinTok();
            iecpMin = this->GetScanner()->IecpMinTok();

            this->GetScanner()->Scan();
            if (m_token.tk == tkLParen || this->GetScanner()->FHadNewLine())
            {
                this->GetScanner()->SeekTo(parsedAsync);
            }
            else
            {
                isAsyncMethod = true;
            }
        }

        bool isGenerator = m_scriptContext->GetConfig()->IsES6GeneratorsEnabled() &&
            m_token.tk == tkStar;
        if (isGenerator)
        {
            fncDeclFlags |= fFncGenerator;
            this->GetScanner()->ScanForcingPid();
        }


        if (m_token.tk == tkLBrack && m_scriptContext->GetConfig()->IsES6ObjectLiteralsEnabled())
        {
            // Computed member name: [expr] () { }
            LPCOLESTR emptyHint = nullptr;
            ParseComputedName<buildAST>(&pnodeMemberName, &emptyHint, &pMemberNameHint, &memberNameHintLength, &memberNameOffset);
            isComputedName = true;
        }
        else // not computed name
        {
            maybeAccessor = !this->GetScanner()->LastIdentifierHasEscape();
            memberPid = this->ParseClassPropertyName(&pidHint);
            if (pidHint)
            {
                pMemberNameHint = pidHint->Psz();
                memberNameHintLength = pidHint->Cch();
            }
        }

        if (buildAST && memberPid)
        {
            pnodeMemberName = CreateStrNode(memberPid);
        }

        if (!isStatic && memberPid == wellKnownPropertyPids.constructor)
        {
            if (hasConstructor || isAsyncMethod)
            {
                Error(ERRsyntax);
            }
            hasConstructor = true;
            LPCOLESTR pConstructorName = nullptr;
            uint32  constructorNameLength = 0;
            uint32  constructorShortNameHintOffset = 0;
            if (pnodeName && pnodeName->pid)
            {
                pConstructorName = pnodeName->pid->Psz();
                constructorNameLength = pnodeName->pid->Cch();
            }
            else
            {
                pConstructorName = pNameHint;
                constructorNameLength = nameHintLength;
                constructorShortNameHintOffset = nameHintOffset;
            }

            {
                SuperRestrictionState::State state = hasExtends ? SuperRestrictionState::CallAndPropertyAllowed : SuperRestrictionState::PropertyAllowed;

                // Add the class constructor flag and base class constructor flag if pnodeExtends is nullptr
                fncDeclFlags |= fFncClassConstructor | (hasExtends ? kFunctionNone : fFncBaseClassConstructor);
                pnodeConstructor = ParseFncDeclNoCheckScope<buildAST>(fncDeclFlags, state, pConstructorName, /* needsPIDOnRCurlyScan */ true);
            }

            if (pnodeConstructor->IsGenerator())
            {
                Error(ERRConstructorCannotBeGenerator);
            }

            Assert(constructorNameLength >= constructorShortNameHintOffset);
            // The constructor function will get the same name as class.
            pnodeConstructor->hint = pConstructorName;
            pnodeConstructor->hintLength = constructorNameLength;
            pnodeConstructor->hintOffset = constructorShortNameHintOffset;
            pnodeConstructor->pid = pnodeName && pnodeName->pid ? pnodeName->pid : wellKnownPropertyPids.constructor;
            pnodeConstructor->SetHasNonThisStmt();
            pnodeConstructor->SetHasHomeObj();
        }
        else
        {
            ParseNodePtr pnodeMember = nullptr;
            RestorePoint beginMethodName;
            this->GetScanner()->Capture(&beginMethodName);

            if (maybeAccessor && (memberPid == wellKnownPropertyPids.get || memberPid == wellKnownPropertyPids.set))
            {
                this->GetScanner()->ScanForcingPid();
            }

            if (m_token.tk == tkLParen)
            {
                this->GetScanner()->SeekTo(beginMethodName);
                maybeAccessor = false;
            }

            if (maybeAccessor && (memberPid == wellKnownPropertyPids.get || memberPid == wellKnownPropertyPids.set))
            {
                bool isGetter = (memberPid == wellKnownPropertyPids.get);

                if (m_token.tk == tkLBrack && m_scriptContext->GetConfig()->IsES6ObjectLiteralsEnabled())
                {
                    // Computed get/set member name: get|set [expr] () { }
                    LPCOLESTR emptyHint = nullptr;
                    ParseComputedName<buildAST>(&pnodeMemberName, &emptyHint, &pMemberNameHint, &memberNameHintLength, &memberNameOffset);
                    isComputedName = true;
                }
                else // not computed name
                {
                    memberPid = this->ParseClassPropertyName(&pidHint);
                }

                if ((isStatic ? (memberPid == wellKnownPropertyPids.prototype) : (memberPid == wellKnownPropertyPids.constructor)) || isAsyncMethod)
                {
                    Error(ERRsyntax);
                }
                if (buildAST && memberPid && !isComputedName)
                {
                    pnodeMemberName = CreateStrNode(memberPid);
                }

                ParseNodeFnc * pnodeFnc = nullptr;
                {
                    pnodeFnc = ParseFncDeclNoCheckScope<buildAST>(fncDeclFlags | (isGetter ? fFncNoArg : fFncOneArg),
                        SuperRestrictionState::PropertyAllowed, pidHint ? pidHint->Psz() : nullptr, /* needsPIDOnRCurlyScan */ true);
                }

                pnodeFnc->SetIsStaticMember(isStatic);
                if (isComputedName)
                {
                    pnodeFnc->SetHasComputedName();
                }
                pnodeFnc->SetHasHomeObj();

                if (buildAST)
                {
                    pnodeFnc->SetIsAccessor();
                    pnodeMember = CreateBinNode(isGetter ? knopGetMember : knopSetMember, pnodeMemberName, pnodeFnc);
                    pMemberNameHint = ConstructFinalHintNode(pClassNamePid, pidHint,
                        isGetter ? wellKnownPropertyPids.get : wellKnownPropertyPids.set, isStatic,
                        &memberNameHintLength, &memberNameOffset, isComputedName, pMemberNameHint);
                }
            }
            else
            {
                if (isStatic && (memberPid == wellKnownPropertyPids.prototype))
                {
                    Error(ERRsyntax);
                }

                ParseNodeFnc * pnodeFnc = nullptr;
                {
                    if (isAsyncMethod)
                    {
                        fncDeclFlags |= fFncAsync;
                    }
                    pnodeFnc = ParseFncDeclNoCheckScope<buildAST>(fncDeclFlags, SuperRestrictionState::PropertyAllowed, pidHint ? pidHint->Psz() : nullptr, /* needsPIDOnRCurlyScan */ true);

                    if (isAsyncMethod || isGenerator || isComputedName)
                    {
                        pnodeFnc->cbStringMin = iecpMin;
                        pnodeFnc->cbStringLim = pnodeFnc->cbLim;
                    }
                }
                pnodeFnc->SetIsStaticMember(isStatic);
                if (isComputedName)
                {
                    pnodeFnc->SetHasComputedName();
                }
                pnodeFnc->SetHasHomeObj();

                if (buildAST)
                {
                    pnodeMember = CreateBinNode(knopMember, pnodeMemberName, pnodeFnc);
                    pMemberNameHint = ConstructFinalHintNode(pClassNamePid, pidHint, nullptr /*pgetset*/, isStatic, &memberNameHintLength, &memberNameOffset, isComputedName, pMemberNameHint);
                }
            }

            if (buildAST)
            {
                Assert(memberNameHintLength >= memberNameOffset);
                pnodeMember->AsParseNodeBin()->pnode2->AsParseNodeFnc()->hint = pMemberNameHint; // Fully qualified name
                pnodeMember->AsParseNodeBin()->pnode2->AsParseNodeFnc()->hintLength = memberNameHintLength;
                pnodeMember->AsParseNodeBin()->pnode2->AsParseNodeFnc()->hintOffset = memberNameOffset;
                pnodeMember->AsParseNodeBin()->pnode2->AsParseNodeFnc()->pid = memberPid; // Short name

                AddToNodeList(&pnodeMembers, &lastMemberNodeRef, pnodeMember);
            }
        }
    }

    size_t cbLimConstructor = 0;
    if (buildAST)
    {
        pnodeClass->ichLim = this->GetScanner()->IchLimTok();
        cbLimConstructor = this->GetScanner()->IecpLimTok();
    }

    if (!hasConstructor)
    {
        OUTPUT_TRACE_DEBUGONLY(Js::ES6VerboseFlag, _u("Generating constructor (%s) : %s\n"), GetParseType(), name ? name->Psz() : _u("anonymous class"));

        RestorePoint endClass;
        this->GetScanner()->Capture(&endClass);
        this->GetScanner()->SeekTo(beginClass);

        pnodeConstructor = GenerateEmptyConstructor<buildAST>(pnodeExtends != nullptr);

        if (buildAST)
        {
            if (pClassNamePid)
            {
                pnodeConstructor->hint = pClassNamePid->Psz();
                pnodeConstructor->hintLength = pClassNamePid->Cch();
                pnodeConstructor->hintOffset = 0;
            }
            else
            {
                Assert(nameHintLength >= nameHintOffset);
                pnodeConstructor->hint = pNameHint;
                pnodeConstructor->hintLength = nameHintLength;
                pnodeConstructor->hintOffset = nameHintOffset;
            }
            pnodeConstructor->pid = pClassNamePid;
        }

        this->GetScanner()->SeekTo(endClass);
    }

    if (buildAST)
    {
        pnodeConstructor->cbStringMin = cbMinConstructor;
        pnodeConstructor->cbStringLim = cbLimConstructor;

        PopFuncBlockScope(ppnodeScopeSave, ppnodeExprScopeSave);

        pnodeClass->pnodeDeclName = pnodeDeclName;
        pnodeClass->pnodeName = pnodeName;
        pnodeClass->pnodeConstructor = pnodeConstructor;
        pnodeClass->pnodeExtends = pnodeExtends;
        pnodeClass->pnodeMembers = pnodeMembers;
        pnodeClass->isDefaultModuleExport = false;
    }
    FinishParseBlock(pnodeBlock);

    m_fUseStrictMode = strictSave;

    this->GetScanner()->Scan();

    return pnodeClass;
}